

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O0

bool __thiscall
iDynTree::MatrixDynSize::setVal(MatrixDynSize *this,size_t row,size_t col,double new_el)

{
  double *pdVar1;
  size_t sVar2;
  ulong in_RDX;
  ulong in_RSI;
  MatrixDynSize *in_RDI;
  double in_XMM0_Qa;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  sVar2 = rows(in_RDI);
  if ((in_RSI <= sVar2) && (sVar2 = cols(in_RDI), in_RDX <= sVar2)) {
    pdVar1 = in_RDI->m_data;
    sVar2 = rawIndexRowMajor(in_RDI,in_RSI,in_RDX);
    pdVar1[sVar2] = in_XMM0_Qa;
    return true;
  }
  reportError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(char *)0x6be6da);
  return false;
}

Assistant:

bool MatrixDynSize::setVal(const std::size_t row, const std::size_t col, const double new_el)
{
    if( row > this->rows() ||
        col   > this->cols() )
    {
        reportError("MatrixDynSize","setVal","indices out of bounds");
        return false;
    }

    this->m_data[rawIndexRowMajor(row,col)] = new_el;
    return true;
}